

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void ActionUnserialize::
     SerReadWriteMany<DataStream,std::__cxx11::string&,unsigned_long&,int&,int&,int&>
               (DataStream *s,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               unsigned_long *args_1,int *args_2,int *args_3,int *args_4)

{
  long lVar1;
  unsigned_long *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  DataStream *in_RSI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnserializeMany<DataStream,std::__cxx11::string&,unsigned_long&,int&,int&,int&>
            (in_RSI,in_RDX,in_RCX,in_R8,in_R9,(int *)0x17947b5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }